

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_trainer.cpp
# Opt level: O3

void __thiscall Am_Gesture_Trainer_Data::~Am_Gesture_Trainer_Data(Am_Gesture_Trainer_Data *this)

{
  Gesture_Class *pGVar1;
  Gesture_Class *this_00;
  
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002e2368;
  this_00 = this->head;
  while (this_00 != (Gesture_Class *)0x0) {
    pGVar1 = this_00->next;
    Am_Value_List::~Am_Value_List(&this_00->examples);
    Am_String::~Am_String(&this_00->name);
    operator_delete(this_00);
    this_00 = pGVar1;
  }
  this->head = (Gesture_Class *)0x0;
  this->tail = (Gesture_Class *)0x0;
  Am_Gesture_Classifier::~Am_Gesture_Classifier(&this->cached_classifier);
  return;
}

Assistant:

Am_Gesture_Trainer_Data::~Am_Gesture_Trainer_Data()
{
  Gesture_Class *c, *next;

  for (c = head; c != nullptr; c = next) {
    next = c->next;
    delete c;
  }
  head = tail = nullptr;
}